

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers_test.cpp
# Opt level: O0

void __thiscall
PaddedSobolSampler_ElementaryIntervals_Test::PaddedSobolSampler_ElementaryIntervals_Test
          (PaddedSobolSampler_ElementaryIntervals_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__PaddedSobolSampler_ElementaryIntervals_Test_0373fc00;
  return;
}

Assistant:

TEST(PaddedSobolSampler, ElementaryIntervals) {
    for (auto rand :
         {RandomizeStrategy::None, RandomizeStrategy::Owen, RandomizeStrategy::Xor})
        for (int logSamples = 2; logSamples <= 10; ++logSamples)
            checkElementarySampler("PaddedSobolSampler",
                                   new PaddedSobolSampler(1 << logSamples, rand),
                                   logSamples);
}